

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcControllerType::~IfcControllerType(IfcControllerType *this,void **vtt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  void *pvVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  long *plVar5;
  
  pvVar2 = *vtt;
  *(void **)&(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
             super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject = pvVar2;
  *(void **)(&(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
              super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x0 +
            *(long *)((long)pvVar2 + -0x18)) = vtt[0x34];
  *(void **)&(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
             super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x88 = vtt[0x35];
  (this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
  super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x36];
  *(void **)&(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
             super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 = vtt[0x37];
  *(void **)&(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
             super_IfcElementType.super_IfcTypeProduct.field_0x148 = vtt[0x38];
  *(void **)&(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
             super_IfcElementType.field_0x180 = vtt[0x39];
  *(void **)&(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
             super_IfcElementType.field_0x190 = vtt[0x3a];
  *(void **)&(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
             field_0x1a0 = vtt[0x3b];
  puVar3 = *(undefined1 **)&(this->super_IfcDistributionControlElementType).field_0x1b0;
  if (puVar3 != &this->field_0x1c0) {
    operator_delete(puVar3,*(long *)&this->field_0x1c0 + 1);
  }
  pvVar2 = vtt[3];
  *(void **)&(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
             super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject = pvVar2;
  *(void **)(&(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
              super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x0 +
            *(long *)((long)pvVar2 + -0x18)) = vtt[0x1c];
  *(void **)&(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
             super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x88 = vtt[0x1d];
  (this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
  super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x1e];
  *(void **)&(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
             super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 = vtt[0x1f];
  *(void **)&(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
             super_IfcElementType.super_IfcTypeProduct.field_0x148 = vtt[0x20];
  puVar4 = *(undefined1 **)
            &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
             super_IfcElementType.super_IfcTypeProduct.field_0x158;
  puVar3 = &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
            super_IfcElementType.field_0x168;
  if (puVar4 != puVar3) {
    operator_delete(puVar4,*(long *)puVar3 + 1);
  }
  pvVar2 = vtt[4];
  *(void **)&(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
             super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject = pvVar2;
  *(void **)(&(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
              super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x0 +
            *(long *)((long)pvVar2 + -0x18)) = vtt[0x16];
  *(void **)&(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
             super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x88 = vtt[0x17];
  (this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
  super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x18];
  *(void **)&(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
             super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 = vtt[0x19];
  plVar5 = (long *)(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
                   super_IfcElementType.super_IfcTypeProduct.Tag.ptr._M_dataplus._M_p;
  paVar1 = &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
            super_IfcElementType.super_IfcTypeProduct.Tag.ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar5 != paVar1) {
    operator_delete(plVar5,paVar1->_M_allocated_capacity + 1);
  }
  pvVar2 = *(void **)&(this->super_IfcDistributionControlElementType).
                      super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
                      super_IfcTypeObject.field_0x100;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,*(long *)&(this->super_IfcDistributionControlElementType).
                                     super_IfcDistributionElementType.super_IfcElementType.
                                     super_IfcTypeProduct.field_0x110 - (long)pvVar2);
  }
  IfcTypeObject::~IfcTypeObject((IfcTypeObject *)this,vtt + 5);
  return;
}

Assistant:

IfcControllerType() : Object("IfcControllerType") {}